

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_playground.cpp
# Opt level: O2

int main(void)

{
  MyClass *pMVar1;
  ostream *poVar2;
  shared_ptr_t<MyClass> s_ptr;
  shared_ptr_t<MyClass> mc2;
  
  pMVar1 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar1,10);
  estl::shared_ptr<MyClass>::shared_ptr(&s_ptr,pMVar1);
  estl::shared_ptr<MyClass>::shared_ptr(&mc2,&s_ptr);
  poVar2 = std::operator<<((ostream *)&std::cerr,"mc1.use_clount(2) : ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,",  mc1.value: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(s_ptr.ptr_)->val_);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,"mc2.use_count(2) : ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,",  mc2.value: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(mc2.ptr_)->val_);
  std::operator<<(poVar2,"\n");
  pMVar1 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar1,0x14);
  estl::shared_ptr<MyClass>::reset(&s_ptr,pMVar1);
  poVar2 = std::operator<<((ostream *)&std::cerr,"mc1.use_count(1) : ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,",  mc1.value: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(s_ptr.ptr_)->val_);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,"mc2.use_count(1) : ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,",  mc2.value: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(mc2.ptr_)->val_);
  std::operator<<(poVar2,"\n");
  estl::shared_ptr<MyClass>::~shared_ptr(&mc2);
  estl::shared_ptr<MyClass>::~shared_ptr(&s_ptr);
  pMVar1 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar1);
  estl::shared_ptr<MyClass>::shared_ptr(&s_ptr,pMVar1);
  estl::shared_ptr<MyClass>::~shared_ptr(&s_ptr);
  return 0;
}

Assistant:

int main()
{

    {
        shared_ptr_t<MyClass> mc1 = shared_ptr_t<MyClass>(new MyClass(10));
        auto mc2 = mc1;
        cerr << "mc1.use_clount(2) : " << mc1.use_count() << ",  mc1.value: " << mc1->val() <<  "\n";
        cerr << "mc2.use_count(2) : " << mc2.use_count() << ",  mc2.value: " << mc2->val() <<  "\n";
        mc1.reset(new MyClass(20));
        cerr << "mc1.use_count(1) : " << mc1.use_count() << ",  mc1.value: " << mc1->val() <<  "\n";
        cerr << "mc2.use_count(1) : " << mc2.use_count() << ",  mc2.value: " << mc2->val() <<  "\n";
    }

    shared_ptr_t<MyClass> s_ptr = shared_ptr_t<MyClass>(new MyClass());
    return 0;
}